

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchAI.cpp
# Opt level: O0

void __thiscall tiger::trains::ai::SwitchAI::step(SwitchAI *this)

{
  bool bVar1;
  int iVar2;
  vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_> *pvVar3;
  Town *this_00;
  IPost *pIVar4;
  reference ppTVar5;
  vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *this_01;
  vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *pvVar6;
  reference ppTVar7;
  size_type sVar8;
  Train *pTVar9;
  TrainAI *pTVar10;
  TrainAI *pTVar11;
  const_iterator in_RDI;
  TrainAI *bot_2;
  TrainAI *bot_1;
  int i;
  TrainAI *bot;
  iterator __end2;
  iterator __begin2;
  vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *__range2;
  int level;
  int needProductCompacity;
  int population;
  vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
  *in_stack_ffffffffffffff48;
  GoodType type;
  TrainAI *in_stack_ffffffffffffff50;
  __normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
  *in_stack_ffffffffffffff58;
  TrainAI *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffff98;
  int local_3c;
  __normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
  local_28;
  TrainAI **local_20;
  int local_14;
  int local_10;
  int local_c;
  
  pvVar3 = trains::world::World::getPlayerList((World *)in_RDI._M_current[1]);
  std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>::
  operator[](pvVar3,0);
  this_00 = (Town *)trains::world::Player::getHome((Player *)0x249fa9);
  local_c = trains::world::Town::getPopulation(this_00);
  pvVar3 = trains::world::World::getPlayerList((World *)in_RDI._M_current[1]);
  std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>::
  operator[](pvVar3,0);
  pIVar4 = trains::world::Player::getHome((Player *)0x249fdc);
  local_14 = (*pIVar4->_vptr_IPost[0xb])();
  local_10 = (local_c + local_14 + -1) * 0x3c;
  local_20 = in_RDI._M_current + 5;
  local_28._M_current =
       (TrainAI **)
       std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
       begin(in_stack_ffffffffffffff48);
  std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::end
            (in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    ppTVar5 = __gnu_cxx::
              __normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
              ::operator*(&local_28);
    pTVar10 = *ppTVar5;
    bVar1 = canSwitch((SwitchAI *)in_stack_ffffffffffffff98._M_current,in_stack_ffffffffffffff90);
    if (!bVar1) {
      pTVar9 = TrainAI::getTrain(pTVar10);
      iVar2 = trains::world::Train::getGoodsCapacity(pTVar9);
      local_10 = local_10 - iVar2;
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
    ::operator++(&local_28);
  }
  local_3c = 0;
  while( true ) {
    this_01 = (vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *
              )(long)local_3c;
    pvVar6 = (vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *)
             std::
             vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
             size((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                   *)(in_RDI._M_current + 5));
    if (pvVar6 <= this_01) break;
    ppTVar7 = std::
              vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
              operator[]((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                          *)(in_RDI._M_current + 5),(long)local_3c);
    pTVar10 = *ppTVar7;
    bVar1 = canSwitch((SwitchAI *)in_stack_ffffffffffffff98._M_current,in_stack_ffffffffffffff90);
    if (bVar1) {
      if ((local_10 < 1) &&
         (sVar8 = std::
                  vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                  ::size((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                          *)(in_RDI._M_current + 5)), 1 < sVar8)) {
        in_stack_ffffffffffffff58 =
             (__normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
              *)(in_RDI._M_current + 5);
        std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
        begin(in_stack_ffffffffffffff48);
        __gnu_cxx::
        __normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
        ::operator+(in_stack_ffffffffffffff58,(difference_type)in_stack_ffffffffffffff50);
        __gnu_cxx::
        __normal_iterator<tiger::trains::ai::TrainAI*const*,std::vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>>
        ::__normal_iterator<tiger::trains::ai::TrainAI**>
                  ((__normal_iterator<tiger::trains::ai::TrainAI_*const_*,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
                    *)in_stack_ffffffffffffff50,
                   (__normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
                    *)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff98 =
             std::
             vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
             erase(this_01,in_RDI);
        TrainAI::changeType(in_stack_ffffffffffffff50,
                            (GoodType)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
        push_back(this_01,(value_type *)in_stack_ffffffffffffff58);
        local_3c = local_3c + -1;
      }
      else {
        pTVar9 = TrainAI::getTrain(pTVar10);
        iVar2 = trains::world::Train::getGoodsCapacity(pTVar9);
        local_10 = local_10 - iVar2;
      }
    }
    local_3c = local_3c + 1;
  }
  local_3c = 0;
  while( true ) {
    pTVar10 = (TrainAI *)(long)local_3c;
    pTVar11 = (TrainAI *)
              std::
              vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
              size((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                    *)(in_RDI._M_current + 2));
    if (pTVar11 <= pTVar10) break;
    ppTVar7 = std::
              vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
              operator[]((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                          *)(in_RDI._M_current + 2),(long)local_3c);
    bVar1 = canSwitch((SwitchAI *)in_stack_ffffffffffffff98._M_current,*ppTVar7);
    if (((bVar1) && (0 < local_10)) &&
       (sVar8 = std::
                vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                ::size((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                        *)(in_RDI._M_current + 2)), 1 < sVar8)) {
      pvVar6 = (vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                *)(in_RDI._M_current + 2);
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      begin(pvVar6);
      __gnu_cxx::
      __normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
      ::operator+(in_stack_ffffffffffffff58,(difference_type)pTVar10);
      __gnu_cxx::
      __normal_iterator<tiger::trains::ai::TrainAI*const*,std::vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>>
      ::__normal_iterator<tiger::trains::ai::TrainAI**>
                ((__normal_iterator<tiger::trains::ai::TrainAI_*const_*,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
                  *)pTVar10,
                 (__normal_iterator<tiger::trains::ai::TrainAI_**,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
                  *)pvVar6);
      type = (GoodType)((ulong)pvVar6 >> 0x20);
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      erase(this_01,in_RDI);
      TrainAI::changeType(pTVar10,type);
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      push_back(this_01,(value_type *)in_stack_ffffffffffffff58);
    }
    else {
      local_3c = local_3c + 1;
    }
  }
  return;
}

Assistant:

void SwitchAI::step()
{
    int population = static_cast<world::Town *>(world->getPlayerList()[0]->getHome())->getPopulation();
    int needProductCompacity;
    int level = static_cast<world::Town *>(world->getPlayerList()[0]->getHome())->getLevel();

    needProductCompacity = 60 *(population + level - 1);


    for (TrainAI *bot : productBots)
        if (!canSwitch(bot))
            needProductCompacity -= bot->getTrain()->getGoodsCapacity();


    int i = 0;

    while (i < productBots.size())
    {
        TrainAI *bot = productBots[i];

        if (canSwitch(bot))
            if (needProductCompacity > 0 || productBots.size() < 2)
                needProductCompacity -= bot->getTrain()->getGoodsCapacity();
            else
            {
                productBots.erase(productBots.begin() + i);
                bot->changeType(models::GoodType::ARMOR);
                armorBots.push_back(bot);
                i--;
            }

        i++;
    }

    i = 0;

    while (i < armorBots.size())
    {
        TrainAI *bot = armorBots[i];

        if (canSwitch(bot) && needProductCompacity > 0 && armorBots.size() > 1)
        {
            armorBots.erase(armorBots.begin() + i);
            bot->changeType(models::GoodType::PRODUCT);
            productBots.push_back(bot);
        }
        else
            i++;
    }
}